

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void __thiscall
Diligent::ThreadPoolImpl::ThreadPoolImpl
          (ThreadPoolImpl *this,IReferenceCounters *pRefCounters,ThreadPoolCreateInfo *PoolCI)

{
  _Rb_tree_header *p_Var1;
  function<void_(unsigned_int)> *this_00;
  function<void_(unsigned_int)> *this_01;
  ulong uVar2;
  anon_class_88_3_32cfcbc8_for__M_head_impl local_88;
  
  RefCountedObject<Diligent::IThreadPool>::RefCountedObject<>
            ((RefCountedObject<Diligent::IThreadPool> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IThreadPool>).super_RefCountedObject<Diligent::IThreadPool>.
  super_IThreadPool.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00948620;
  p_Var1 = &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WorkerThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_TasksQueueMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_TasksQueueMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_TasksQueueMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ReprioritizationList).
  super__Vector_base<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->m_NextTaskCond);
  std::condition_variable::condition_variable(&this->m_TasksFinishedCond);
  (this->m_Stop)._M_base._M_i = false;
  (this->m_NumRunningTasks).super___atomic_base<int>._M_i = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (&this->m_WorkerThreads,PoolCI->NumThreads);
  local_88.PoolCI.NumThreads = PoolCI->NumThreads;
  if (local_88.PoolCI.NumThreads != 0) {
    this_00 = &local_88.PoolCI.OnThreadStarted;
    this_01 = &local_88.PoolCI.OnThreadExiting;
    uVar2 = 0;
    do {
      local_88.this = this;
      std::function<void_(unsigned_int)>::function(this_00,&PoolCI->OnThreadStarted);
      std::function<void_(unsigned_int)>::function(this_01,&PoolCI->OnThreadExiting);
      local_88.i = (Uint32)uVar2;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<Diligent::ThreadPoolImpl::ThreadPoolImpl(Diligent::IReferenceCounters*,Diligent::ThreadPoolCreateInfo_const&)::_lambda()_1_>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->m_WorkerThreads,&local_88
                );
      if (local_88.PoolCI.OnThreadExiting.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_88.PoolCI.OnThreadExiting.super__Function_base._M_manager)
                  ((_Any_data *)this_01,(_Any_data *)this_01,__destroy_functor);
      }
      if (local_88.PoolCI.OnThreadStarted.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_88.PoolCI.OnThreadStarted.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      uVar2 = (ulong)((Uint32)uVar2 + 1);
      local_88.PoolCI.NumThreads = PoolCI->NumThreads;
    } while (uVar2 < local_88.PoolCI.NumThreads);
  }
  return;
}

Assistant:

ThreadPoolImpl(IReferenceCounters*         pRefCounters,
                   const ThreadPoolCreateInfo& PoolCI) :
        TBase{pRefCounters}
    {
        m_WorkerThreads.reserve(PoolCI.NumThreads);
        for (Uint32 i = 0; i < PoolCI.NumThreads; ++i)
        {
            m_WorkerThreads.emplace_back(
                [this, PoolCI, i] //
                {
                    if (PoolCI.OnThreadStarted)
                        PoolCI.OnThreadStarted(i);

                    while (ProcessTask(i, /*WaitForTask =*/true))
                    {
                    }

                    if (PoolCI.OnThreadExiting)
                        PoolCI.OnThreadExiting(i);
                });
        }
    }